

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O0

ssize_t __thiscall llvm::raw_ostream::write(raw_ostream *this,int __fd,void *__buf,size_t __n)

{
  byte *pbVar1;
  ssize_t sVar2;
  raw_ostream *__n_00;
  void *__buf_00;
  byte local_19;
  raw_ostream *prStack_18;
  uchar C_local;
  raw_ostream *this_local;
  
  local_19 = (byte)__fd;
  if (this->OutBufEnd <= this->OutBufCur) {
    prStack_18 = this;
    if (this->OutBufStart == (char *)0x0) {
      if (this->BufferMode == Unbuffered) {
        (*this->_vptr_raw_ostream[8])(this,&local_19,1);
        return (ssize_t)this;
      }
      __n_00 = this;
      SetBuffered(this);
      sVar2 = write(this,(uint)local_19,__buf_00,(size_t)__n_00);
      return sVar2;
    }
    flush_nonempty(this);
  }
  pbVar1 = (byte *)this->OutBufCur;
  this->OutBufCur = (char *)(pbVar1 + 1);
  *pbVar1 = local_19;
  return (ssize_t)this;
}

Assistant:

raw_ostream &raw_ostream::write(unsigned char C) {
  // Group exceptional cases into a single branch.
  if (LLVM_UNLIKELY(OutBufCur >= OutBufEnd)) {
    if (LLVM_UNLIKELY(!OutBufStart)) {
      if (BufferMode == BufferKind::Unbuffered) {
        write_impl(reinterpret_cast<char*>(&C), 1);
        return *this;
      }
      // Set up a buffer and start over.
      SetBuffered();
      return write(C);
    }

    flush_nonempty();
  }

  *OutBufCur++ = C;
  return *this;
}